

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O3

bool medit_size(CHAR_DATA *ch,char *argument)

{
  void *pvVar1;
  int iVar2;
  
  if (*argument != '\0') {
    pvVar1 = ch->desc->pEdit;
    iVar2 = flag_value(size_flags,argument);
    if (iVar2 != -99) {
      *(short *)((long)pvVar1 + 0x148) = (short)iVar2;
      send_to_char("Size set.\n\r",ch);
      return true;
    }
  }
  send_to_char("Syntax: size [size]\n\rType \'? size\' for a list of sizes.\n\r",ch);
  return false;
}

Assistant:

bool medit_size(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMob;
	int value;

	if (argument[0] != '\0')
	{
		EDIT_MOB(ch, pMob);

		value = flag_value(size_flags, argument);

		if (value != NO_FLAG)
		{
			pMob->size = value;
			send_to_char("Size set.\n\r", ch);
			return true;
		}
	}

	send_to_char("Syntax: size [size]\n\r"\
				 "Type '? size' for a list of sizes.\n\r",
				 ch);
	return false;
}